

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O3

void keypoint_approach(Mat *image_model,Mat *image_test)

{
  pointer pKVar1;
  void *pvVar2;
  bool bVar3;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_test;
  _InputArray *keypoint_model;
  long *local_378;
  undefined8 uStack_370;
  long local_368 [3];
  undefined1 local_350 [24];
  Mat local_338 [96];
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  knn_matches;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> filtered_matches;
  Ptr<cv::DescriptorMatcher> matcher;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  _InputArray local_298;
  undefined8 uStack_280;
  void *local_278;
  undefined8 uStack_270;
  long local_268;
  undefined4 local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  _InputArray local_248;
  pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> local_230;
  Mat img_keypoint_test;
  Mat img_keypoint_model;
  ORB_Param local_f8;
  ORB_Param local_d8;
  _InputOutputArray local_c0;
  _InputArray local_a8;
  Mat img_keypoint_matches;
  
  pKVar1 = (pointer)(local_350 + 0x10);
  local_350._0_8_ = pKVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"pretreat model","");
  cv::namedWindow((string *)local_350,0);
  if ((pointer)local_350._0_8_ != pKVar1) {
    operator_delete((void *)local_350._0_8_,(ulong)((long)&((Point2f *)local_350._16_8_)->x + 1));
  }
  local_350._0_8_ = pKVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"pretreat model","");
  local_230.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  local_230.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)image_model;
  cv::imshow((string *)local_350,(_InputArray *)&local_230);
  if ((pointer)local_350._0_8_ != pKVar1) {
    operator_delete((void *)local_350._0_8_,(ulong)((long)&((Point2f *)local_350._16_8_)->x + 1));
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  local_350._0_8_ = pKVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"pretreat test","");
  cv::namedWindow((string *)local_350,0);
  if ((pointer)local_350._0_8_ != pKVar1) {
    operator_delete((void *)local_350._0_8_,(ulong)((long)&((Point2f *)local_350._16_8_)->x + 1));
  }
  local_350._0_8_ = pKVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"pretreat test","");
  local_230.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  local_230.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)image_test;
  cv::imshow((string *)local_350,(_InputArray *)&local_230);
  if ((pointer)local_350._0_8_ != pKVar1) {
    operator_delete((void *)local_350._0_8_,(ulong)((long)&((Point2f *)local_350._16_8_)->x + 1));
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  local_d8.patchSize = 0x1f;
  local_d8.WTA_K = 2;
  local_f8.patchSize = 0x1f;
  local_f8.WTA_K = 4;
  local_d8.nfeature = 10000;
  local_d8.nlevels = 8;
  local_d8.edgeThreshold = 0x1f;
  local_d8.fastThreshold = 0x14;
  local_f8.nfeature = 10000;
  local_f8.nlevels = 8;
  local_f8.edgeThreshold = 100;
  local_f8.fastThreshold = 0x14;
  keypoint_compute((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
                   local_350,image_model,&local_d8);
  keypoint_compute(&local_230,image_test,&local_f8);
  _img_keypoint_model = 4;
  cv::DescriptorMatcher::create((MatcherType *)&matcher);
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _img_keypoint_model = 0x1010000;
  _img_keypoint_test = 0x1010000;
  bVar3 = (bool)cv::noArray();
  keypoint_model = (_InputArray *)&img_keypoint_model;
  cv::DescriptorMatcher::knnMatch
            (_matcher,(_InputArray *)&img_keypoint_model,(vector *)&img_keypoint_test,
             (int)&knn_matches,(_InputArray *)0x2,bVar3);
  filter_match(&filtered_matches,
               (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)keypoint_model,keypoint_test,
               &knn_matches,0.75);
  cv::Mat::Mat(&img_keypoint_model);
  cv::Mat::Mat(&img_keypoint_test);
  cv::Mat::Mat(&img_keypoint_matches);
  local_298.sz.width = 0;
  local_298.sz.height = 0;
  local_298.flags = 0x1010000;
  local_248.sz.width = 0;
  local_248.sz.height = 0;
  local_248.flags = 0x3010000;
  local_258 = 0;
  uStack_254 = 0;
  uStack_250 = 0;
  uStack_24c = 0x406fe000;
  local_378 = (long *)0x0;
  uStack_370 = 0x406fe00000000000;
  local_368[0] = 0;
  local_368[1] = 0;
  local_298.obj = image_model;
  local_248.obj = (_InputArray *)&img_keypoint_model;
  cv::drawKeypoints(&local_298,(vector *)local_350,(_InputOutputArray *)&local_248,
                    (Scalar_ *)&local_378,DEFAULT);
  local_298.sz.width = 0;
  local_298.sz.height = 0;
  local_298.flags = 0x1010000;
  local_248.sz.width = 0;
  local_248.sz.height = 0;
  local_248.flags = 0x3010000;
  local_378 = (long *)CONCAT44(uStack_254,local_258);
  uStack_370 = CONCAT44(uStack_24c,uStack_250);
  local_368[0] = 0;
  local_368[1] = 0;
  local_298.obj = image_test;
  local_248.obj = &img_keypoint_test;
  cv::drawKeypoints(&local_298,(vector *)&local_230,(_InputOutputArray *)&local_248,
                    (Scalar_ *)&local_378,DEFAULT);
  local_248.sz.width = 0;
  local_248.sz.height = 0;
  local_248.flags = 0x1010000;
  local_a8.sz.width = 0;
  local_a8.sz.height = 0;
  local_a8.flags = 0x1010000;
  local_c0.super__OutputArray.super__InputArray.sz.width = 0;
  local_c0.super__OutputArray.super__InputArray.sz.height = 0;
  local_c0.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_378 = (long *)0xbff0000000000000;
  uStack_370 = 0xbff0000000000000;
  local_368[0] = -0x4010000000000000;
  local_368[1] = 0xbff0000000000000;
  local_298.flags = 0;
  local_298._4_4_ = 0xbff00000;
  local_298.obj = (void *)0xbff0000000000000;
  local_298.sz.width = 0;
  local_298.sz.height = -0x40100000;
  uStack_280 = 0xbff0000000000000;
  local_268 = 0;
  local_278 = (void *)0x0;
  uStack_270 = 0;
  local_248.obj = image_model;
  local_c0.super__OutputArray.super__InputArray.obj = &img_keypoint_matches;
  local_a8.obj = image_test;
  cv::drawMatches(&local_248,(vector *)local_350,&local_a8,(vector *)&local_230,
                  (vector *)&filtered_matches,&local_c0,(Scalar_ *)&local_378,(Scalar_ *)&local_298,
                  (vector *)&local_278,DEFAULT);
  if (local_278 != (void *)0x0) {
    operator_delete(local_278,local_268 - (long)local_278);
  }
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Keypoint model","");
  cv::namedWindow((string *)&local_378,0);
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Keypoint model","");
  local_298.sz.width = 0;
  local_298.sz.height = 0;
  local_298.flags = 0x1010000;
  local_298.obj = (_InputArray *)&img_keypoint_model;
  cv::imshow((string *)&local_378,&local_298);
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Keypoint test","");
  cv::namedWindow((string *)&local_378,0);
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Keypoint test","");
  local_298.sz.width = 0;
  local_298.sz.height = 0;
  local_298.flags = 0x1010000;
  local_298.obj = &img_keypoint_test;
  cv::imshow((string *)&local_378,&local_298);
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Keypoint matches","");
  cv::namedWindow((string *)&local_378,0);
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Keypoint matches","");
  local_298.sz.width = 0;
  local_298.sz.height = 0;
  local_298.flags = 0x1010000;
  local_298.obj = &img_keypoint_matches;
  cv::imshow((string *)&local_378,&local_298);
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  cv::Mat::~Mat(&img_keypoint_matches);
  cv::Mat::~Mat(&img_keypoint_test);
  cv::Mat::~Mat(&img_keypoint_model);
  if (filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)filtered_matches.
                          super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)filtered_matches.
                          super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ::~vector(&knn_matches);
  if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0);
  }
  cv::Mat::~Mat(&local_230.second);
  pvVar2 = (void *)CONCAT44(local_230.first.
                            super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_230.first.
                            super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_230.first.
                                 super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  cv::Mat::~Mat(local_338);
  if ((pointer)local_350._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_350._0_8_,local_350._16_8_ - local_350._0_8_);
  }
  return;
}

Assistant:

void keypoint_approach(const cv::Mat& image_model, const cv::Mat& image_test)
{
    cv::namedWindow("pretreat model", cv::WINDOW_NORMAL);
    cv::imshow("pretreat model", image_model);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("pretreat test", cv::WINDOW_NORMAL);
    cv::imshow("pretreat test", image_test);
    cv::waitKey(0);
    cv::destroyAllWindows();

    ORB_Param param_model, test_param;
    param_model.nfeature = 10000;

    test_param.nfeature = 10000;
    // test_param.nlevels = 16;
    test_param.WTA_K = 4;
    test_param.edgeThreshold = 100;

    auto [keypoint_model, descriptor_model] = keypoint_compute(image_model, param_model);
    auto [keypoint_test, descriptor_test] = keypoint_compute(image_test, test_param);

#if CV_MAJOR_VERSION < 3
    auto matcher = cv::DescriptorMatcher::create("NORM_HAMMING");
#else
    auto matcher = cv::DescriptorMatcher::create(cv::DescriptorMatcher::BRUTEFORCE_HAMMING);
#endif

    std::vector<std::vector<cv::DMatch>> knn_matches;
    matcher->knnMatch(descriptor_model, descriptor_test, knn_matches, 2);

    const float ratio_thresh = 0.75f;
    std::vector<cv::DMatch> filtered_matches = filter_match(keypoint_model, keypoint_test, knn_matches, ratio_thresh);

    cv::Mat img_keypoint_model, img_keypoint_test, img_keypoint_matches;

    cv::drawKeypoints(image_model, keypoint_model, img_keypoint_model, cv::Scalar(0, 255, 0));
    cv::drawKeypoints(image_test, keypoint_test, img_keypoint_test, cv::Scalar(0, 255, 0));
    cv::drawMatches(image_model, keypoint_model, image_test, keypoint_test, filtered_matches, img_keypoint_matches);

    cv::namedWindow("Keypoint model", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint model", img_keypoint_model);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("Keypoint test", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint test", img_keypoint_test);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("Keypoint matches", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint matches", img_keypoint_matches);
    cv::waitKey(0);
    cv::destroyAllWindows();
}